

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O0

bool __thiscall cmFindProgramHelper::FileIsExecutableCMP0109(cmFindProgramHelper *this,string *file)

{
  cmMakefile *pcVar1;
  PolicyID id;
  string local_b8;
  string local_98;
  string local_68;
  string local_48;
  undefined1 local_22;
  byte local_21;
  bool isExeNew;
  string *psStack_20;
  bool isExeOld;
  string *file_local;
  cmFindProgramHelper *this_local;
  
  psStack_20 = file;
  file_local = (string *)this;
  if (this->PolicyCMP0109 == OLD) {
    this_local._7_1_ = cmsys::SystemTools::FileExists(file,true);
  }
  else if (this->PolicyCMP0109 - NEW < 3) {
    this_local._7_1_ = cmsys::SystemTools::FileIsExecutable(file);
  }
  else {
    local_21 = cmsys::SystemTools::FileExists(file,true);
    local_22 = cmsys::SystemTools::FileIsExecutable(psStack_20);
    this_local._7_1_ = (bool)local_22;
    if (local_22 != (local_21 & 1)) {
      if ((bool)local_22) {
        pcVar1 = this->Makefile;
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_68,(cmPolicies *)0x6d,id);
        cmStrCat<std::__cxx11::string,char_const(&)[13],std::__cxx11::string_const&,char_const(&)[74]>
                  (&local_48,&local_68,(char (*) [13])"\nThe file\n  ",psStack_20,
                   (char (*) [74])
                   "\nis executable but not readable.  CMake is ignoring it for compatibility.");
        cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        std::__cxx11::string::~string((string *)&local_68);
      }
      else {
        pcVar1 = this->Makefile;
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_b8,(cmPolicies *)0x6d,id);
        cmStrCat<std::__cxx11::string,char_const(&)[13],std::__cxx11::string_const&,char_const(&)[71]>
                  (&local_98,&local_b8,(char (*) [13])"\nThe file\n  ",psStack_20,
                   (char (*) [71])
                   "\nis readable but not executable.  CMake is using it for compatibility.");
        cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_b8);
      }
      this_local._7_1_ = (bool)(local_21 & 1);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool FileIsExecutableCMP0109(std::string const& file) const
  {
    switch (this->PolicyCMP0109) {
      case cmPolicies::OLD:
        return cmSystemTools::FileExists(file, true);
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
        return cmSystemTools::FileIsExecutable(file);
      default:
        break;
    }
    bool const isExeOld = cmSystemTools::FileExists(file, true);
    bool const isExeNew = cmSystemTools::FileIsExecutable(file);
    if (isExeNew == isExeOld) {
      return isExeNew;
    }
    if (isExeNew) {
      this->Makefile->IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0109),
                 "\n"
                 "The file\n"
                 "  ",
                 file,
                 "\n"
                 "is executable but not readable.  "
                 "CMake is ignoring it for compatibility."));
    } else {
      this->Makefile->IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0109),
                 "\n"
                 "The file\n"
                 "  ",
                 file,
                 "\n"
                 "is readable but not executable.  "
                 "CMake is using it for compatibility."));
    }
    return isExeOld;
  }